

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O0

JL_STATUS MarshallObject(void *Input,JlMarshallElement *Description,JlDataObject **pNewObject)

{
  JL_STATUS local_24;
  JL_STATUS jlStatus;
  JlDataObject **pNewObject_local;
  JlMarshallElement *Description_local;
  void *Input_local;
  
  *pNewObject = (JlDataObject *)0x0;
  if (Description->Type == JL_DATA_TYPE_STRING) {
    local_24 = MarshallString(Input,Description,pNewObject);
  }
  else if (Description->Type == JL_DATA_TYPE_NUMBER) {
    local_24 = MarshallNumber(Input,Description,pNewObject);
  }
  else if (Description->Type == JL_DATA_TYPE_BOOL) {
    local_24 = MarshallBool(Input,Description,pNewObject);
  }
  else if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
    local_24 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,pNewObject);
    if (local_24 == JL_STATUS_SUCCESS) {
      local_24 = MarshallDictionary(Input,Description->ChildStructDescription,
                                    (ulong)Description->ChildStructDescriptionCount,*pNewObject);
    }
  }
  else {
    local_24 = JL_STATUS_INVALID_TYPE;
  }
  return local_24;
}

Assistant:

static
JL_STATUS
    MarshallObject
    (
        void const*                 Input,
        JlMarshallElement const*    Description,
        JlDataObject**              pNewObject
    )
{
    JL_STATUS jlStatus;

    *pNewObject = NULL;

    if( JL_DATA_TYPE_STRING == Description->Type )
    {
        // Regular allocated string.
        // Input is a pointer to a string.
        jlStatus = MarshallString( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_NUMBER == Description->Type )
    {
        jlStatus = MarshallNumber( Input, Description, pNewObject );
    }
    else if( JL_DATA_TYPE_BOOL == Description->Type )
    {
        jlStatus = MarshallBool( Input, Description, pNewObject );
    }
    else if (JL_DATA_TYPE_DICTIONARY == Description->Type )
    {
        // This is only called when we are processing dictionary in a list, otherwise dictionaries within
        // dictionaries are processed directly in MarshallDictionary.
        // Dictionaries within a list are always created new, they do not preserve an existing dictionary in
        // the list.
        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, pNewObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = MarshallDictionary( Input, Description->ChildStructDescription, Description->ChildStructDescriptionCount, *pNewObject );
        }
    }
    else
    {
        // Unknown data type
        jlStatus = JL_STATUS_INVALID_TYPE;
    }

    return jlStatus;
}